

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

string * convertWStringToUtf8_abi_cxx11_(string *__return_storage_ptr__,wstring_view source)

{
  char cVar1;
  size_t i;
  size_t sVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (sVar2 = 0; source._M_len != sVar2; sVar2 = sVar2 + 1) {
    cVar1 = (char)__return_storage_ptr__;
    if (L'\x7f' < source._M_str[sVar2]) {
      if ((uint)source._M_str[sVar2] < 0x800) {
        std::__cxx11::string::push_back(cVar1);
      }
      else {
        std::__cxx11::string::push_back(cVar1);
        std::__cxx11::string::push_back(cVar1);
      }
    }
    std::__cxx11::string::push_back(cVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convertWStringToUtf8(std::wstring_view source)
{
	std::string result;
	
	for (size_t i = 0; i < source.size(); i++)
	{
		wchar_t character = source[i];
		if (character < 0x80)
		{
			result += character & 0x7F;
		} else if (character < 0x800)
		{
			result += 0xC0 | ((character >> 6) & 0x1F);
			result += (0x80 | (character & 0x3F));
		} else {
			result += 0xE0 | ((character >> 12) & 0xF);
			result += 0x80 | ((character >> 6) & 0x3F);
			result += 0x80 | (character & 0x3F);
		}
	}

	return result;
}